

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O3

void __thiscall
Equality_variableNotEqualByNameOnly_Test::TestBody(Equality_variableNotEqualByNameOnly_Test *this)

{
  char cVar1;
  byte bVar2;
  char *pcVar3;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  VariablePtr v2;
  VariablePtr v1;
  long *local_70;
  Message local_68;
  undefined7 uStack_67;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  AssertionResult local_58;
  long local_48 [2];
  AssertHelper local_38 [8];
  shared_ptr<libcellml::Variable> local_30;
  shared_ptr<libcellml::Variable> local_20;
  
  local_58._0_8_ = (shared_ptr *)local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"variableA","");
  libcellml::Variable::create((string *)&local_20);
  if ((shared_ptr *)local_58._0_8_ != (shared_ptr *)local_48) {
    operator_delete((void *)local_58._0_8_,local_48[0] + 1);
  }
  local_58._0_8_ = (shared_ptr *)local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"variableB","");
  libcellml::Variable::create((string *)&local_30);
  if ((shared_ptr *)local_58._0_8_ != (shared_ptr *)local_48) {
    operator_delete((void *)local_58._0_8_,local_48[0] + 1);
  }
  testing::internal::
  CmpHelperNE<std::shared_ptr<libcellml::Variable>,std::shared_ptr<libcellml::Variable>>
            ((internal *)&local_58,"v1","v2",&local_20,&local_30);
  if ((string)local_58.success_ == (string)0x0) {
    testing::Message::Message(&local_68);
    if (local_58.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_58.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
               ,0x2d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
    if (((CONCAT71(uStack_67,local_68) != 0) &&
        (cVar1 = testing::internal::IsTrue(true), cVar1 != '\0')) &&
       ((long *)CONCAT71(uStack_67,local_68) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT71(uStack_67,local_68) + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_58.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_58._0_8_ =
       local_30.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_58.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       local_30.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (local_30.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_30.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi + 8) =
           *(int *)(local_30.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_30.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi + 8) =
           *(int *)(local_30.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi + 8) + 1;
    }
  }
  bVar2 = libcellml::Entity::equals
                    ((shared_ptr *)
                     local_20.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
  local_68 = (Message)(bVar2 ^ 1);
  local_60.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_58.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (bVar2 != 0) goto LAB_00110378;
  }
  else {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58.message_.ptr_);
    if (((byte)local_68 & 1) == 0) {
LAB_00110378:
      testing::Message::Message((Message *)&local_70);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_58,(char *)&local_68,"v1->equals(v2)","true");
      testing::internal::AssertHelper::AssertHelper
                (local_38,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
                 ,0x2e,(char *)local_58._0_8_);
      testing::internal::AssertHelper::operator=(local_38,(Message *)&local_70);
      testing::internal::AssertHelper::~AssertHelper(local_38);
      if ((shared_ptr *)local_58._0_8_ != (shared_ptr *)local_48) {
        operator_delete((void *)local_58._0_8_,local_48[0] + 1);
      }
      if (((local_70 != (long *)0x0) && (cVar1 = testing::internal::IsTrue(true), cVar1 != '\0')) &&
         (local_70 != (long *)0x0)) {
        (**(code **)(*local_70 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_58._0_8_ =
       local_20.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_58.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       local_20.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (local_20.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_20.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi + 8) =
           *(int *)(local_20.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_20.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi + 8) =
           *(int *)(local_20.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi + 8) + 1;
    }
  }
  bVar2 = libcellml::Entity::equals
                    ((shared_ptr *)
                     local_30.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
  local_68 = (Message)(bVar2 ^ 1);
  local_60.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_58.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (bVar2 == 0) goto LAB_0011053e;
  }
  else {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58.message_.ptr_);
    if (((byte)local_68 & 1) != 0) goto LAB_0011053e;
  }
  testing::Message::Message((Message *)&local_70);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            (&local_58,(char *)&local_68,"v2->equals(v1)","true");
  testing::internal::AssertHelper::AssertHelper
            (local_38,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
             ,0x2f,(char *)local_58._0_8_);
  testing::internal::AssertHelper::operator=(local_38,(Message *)&local_70);
  testing::internal::AssertHelper::~AssertHelper(local_38);
  if ((shared_ptr *)local_58._0_8_ != (shared_ptr *)local_48) {
    operator_delete((void *)local_58._0_8_,local_48[0] + 1);
  }
  if (((local_70 != (long *)0x0) && (cVar1 = testing::internal::IsTrue(true), cVar1 != '\0')) &&
     (local_70 != (long *)0x0)) {
    (**(code **)(*local_70 + 8))();
  }
LAB_0011053e:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_30.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_20.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

TEST(Equality, unitsNotEqualByUnitIdOnly)
{
    libcellml::UnitsPtr u1 = libcellml::Units::create("unitsA");
    libcellml::UnitsPtr u2 = libcellml::Units::create("unitsA");

    u1->addUnit("second");
    u2->addUnit("second");

    u1->setUnitId(0, "UnitsASecond");

    EXPECT_NE(u1, u2);
    EXPECT_FALSE(u1->equals(u2));
    EXPECT_FALSE(u2->equals(u1));
    EXPECT_TRUE(libcellml::Units::equivalent(u1, u2));
}